

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaPrecision.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)2>::iterate
          (GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)2> *this)

{
  ostringstream *this_00;
  int iVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  GLuint i_1;
  int iVar5;
  deUint32 dVar6;
  deRoundingMode mode;
  undefined4 extraout_var;
  void *pvVar7;
  long lVar8;
  undefined8 *puVar9;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  bool bVar10;
  ulong uVar11;
  GLuint i;
  long lVar12;
  int iVar13;
  int iVar14;
  GLfloat resultCPURTZ [200];
  GLfloat resultCPURNE [200];
  GLfloat resultStd [200];
  GLfloat resultFma [200];
  undefined1 local_e38 [120];
  ios_base local_dc0 [264];
  undefined8 local_cb8 [100];
  undefined8 local_998 [100];
  int local_678 [200];
  int local_358 [202];
  
  initTest(this);
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  lVar12 = 0;
  (**(code **)(lVar8 + 0x30))(0);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBeginTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x112);
  (**(code **)(lVar8 + 0x538))(0,0,100);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Rendering failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x115);
  (**(code **)(lVar8 + 0x638))();
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glEndTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x118);
  (**(code **)(lVar8 + 0x40))(0x8c8e,this->m_vbo_result_fma_id);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x120);
  pvVar7 = (void *)(**(code **)(lVar8 + 0xd00))(0x8c8e,0,800,1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Error mapping buffer object\'s data to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x124);
  memcpy(local_358,pvVar7,800);
  (**(code **)(lVar8 + 0x1670))(0x8c8e);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Error unmapping buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x129);
  (**(code **)(lVar8 + 0x40))(0x8c8e,this->m_vbo_result_std_id);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,300);
  pvVar7 = (void *)(**(code **)(lVar8 + 0xd00))(0x8c8e,0,800,1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Error mapping buffer object\'s data to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x130);
  memcpy(local_678,pvVar7,800);
  (**(code **)(lVar8 + 0x1670))(0x8c8e);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Error unmapping buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x135);
  mode = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
  do {
    local_998[lVar12] =
         CONCAT44((float)((ulong)*(undefined8 *)(this->m_data_c + lVar12 * 2) >> 0x20) +
                  (float)((ulong)*(undefined8 *)(this->m_data_b + lVar12 * 2) >> 0x20) *
                  (float)((ulong)*(undefined8 *)(this->m_data_a + lVar12 * 2) >> 0x20),
                  (float)*(undefined8 *)(this->m_data_c + lVar12 * 2) +
                  (float)*(undefined8 *)(this->m_data_b + lVar12 * 2) *
                  (float)*(undefined8 *)(this->m_data_a + lVar12 * 2));
    lVar12 = lVar12 + 1;
  } while (lVar12 != 100);
  deSetRoundingMode(DE_ROUNDINGMODE_TO_ZERO);
  lVar8 = 0;
  do {
    local_cb8[lVar8] =
         CONCAT44((float)((ulong)*(undefined8 *)(this->m_data_c + lVar8 * 2) >> 0x20) +
                  (float)((ulong)*(undefined8 *)(this->m_data_b + lVar8 * 2) >> 0x20) *
                  (float)((ulong)*(undefined8 *)(this->m_data_a + lVar8 * 2) >> 0x20),
                  (float)*(undefined8 *)(this->m_data_c + lVar8 * 2) +
                  (float)*(undefined8 *)(this->m_data_b + lVar8 * 2) *
                  (float)*(undefined8 *)(this->m_data_a + lVar8 * 2));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 100);
  deSetRoundingMode(mode);
  bVar3 = 1;
  puVar9 = local_998;
LAB_00cb54a6:
  lVar8 = 0;
  bVar2 = true;
  do {
    uVar11 = 0;
    bVar4 = true;
    do {
      bVar10 = bVar4;
      uVar11 = uVar11 | lVar8 * 2;
      iVar5 = *(int *)((long)puVar9 + uVar11 * 4);
      iVar14 = iVar5 - local_358[uVar11];
      iVar1 = -iVar14;
      if (0 < iVar14) {
        iVar1 = iVar14;
      }
      iVar5 = iVar5 - local_678[uVar11];
      iVar14 = -iVar5;
      if (0 < iVar5) {
        iVar14 = iVar5;
      }
      iVar13 = local_358[uVar11] - local_678[uVar11];
      iVar5 = -iVar13;
      if (0 < iVar13) {
        iVar5 = iVar13;
      }
      if (((2 < iVar5) || (2 < iVar1)) || (2 < iVar14)) {
        bVar4 = (bool)(bVar3 & bVar2);
        bVar3 = 0;
        puVar9 = local_cb8;
        if (bVar4) goto LAB_00cb54a6;
        if (!bVar2) goto LAB_00cb55bc;
        local_e38._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_e38 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "The values of resultStd[i] & 0xFFFFFFFE and resultFma[i] & 0xFFFFFFFE and resultCPU[i] & 0xFFFFFFFE "
                   ,100);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"are not bitwise equal for i = 0..99\n",0x24);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_e38,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_dc0);
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Fail";
        testResult = QP_TEST_RESULT_FAIL;
        goto LAB_00cb55c9;
      }
      uVar11 = 1;
      bVar4 = false;
    } while (bVar10);
    lVar8 = lVar8 + 1;
    bVar2 = false;
    if (lVar8 == 100) {
LAB_00cb55bc:
      this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
LAB_00cb55c9:
      tcu::TestContext::setTestResult(this_01,testResult,description);
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShader5FmaPrecision<S>::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Render */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");

	gl.drawArrays(GL_POINTS, 0, m_n_elements);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

	/* Retrieve the result data */
	glw::GLfloat		resultFma[m_n_elements * S];
	glw::GLfloat		resultStd[m_n_elements * S];
	const glw::GLfloat* resultTmp = DE_NULL;

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_vbo_result_fma_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	resultTmp = (const glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
													   m_n_elements * S * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data to client space!");

	memcpy(resultFma, resultTmp, m_n_elements * S * sizeof(glw::GLfloat));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer object's data!");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_vbo_result_std_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	resultTmp = (const glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
													   m_n_elements * S * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data to client space!");

	memcpy(resultStd, resultTmp, m_n_elements * S * sizeof(glw::GLfloat));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer object's data!");

	/* Execute the algorithm from shader on CPU */
	glw::GLfloat resultCPURNE[m_n_elements * S];
	glw::GLfloat resultCPURTZ[m_n_elements * S];

	deRoundingMode previousRoundingMode = deGetRoundingMode();

	deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
	for (glw::GLuint i = 0; i < m_n_elements; ++i)
	{
		for (glw::GLuint j = 0; j < S; ++j)
		{
			resultCPURNE[i * S + j] = m_data_a[i * S + j] * m_data_b[i * S + j] + m_data_c[i * S + j];
		}
	}

	deSetRoundingMode(DE_ROUNDINGMODE_TO_ZERO);
	for (glw::GLuint i = 0; i < m_n_elements; ++i)
	{
		for (glw::GLuint j = 0; j < S; ++j)
		{
			resultCPURTZ[i * S + j] = m_data_a[i * S + j] * m_data_b[i * S + j] + m_data_c[i * S + j];
		}
	}

	/* Restore the rounding mode so subsequent tests aren't affected */
	deSetRoundingMode(previousRoundingMode);

	/* Check results */
	const glw::GLfloat* resultsCPU[] = { resultCPURNE, resultCPURTZ };
	FloatConverter		cpuU;
	FloatConverter		fmaU;
	FloatConverter		stdU;
	glw::GLboolean		test_failed = true;

	for (glw::GLuint roundingMode = 0; test_failed && roundingMode < 2; ++roundingMode)
	{
		glw::GLboolean rounding_mode_failed = false;
		for (glw::GLuint i = 0; i < m_n_elements; ++i)
		{
			for (int j = 0; j < S; ++j)
			{
				/* Assign float value to the union */
				cpuU.m_float = resultsCPU[roundingMode][i * S + j];
				fmaU.m_float = resultFma[i * S + j];
				stdU.m_float = resultStd[i * S + j];

				/* Convert float to int bitwise */
				glw::GLint cpuTemp = cpuU.m_int;
				glw::GLint fmaTemp = fmaU.m_int;
				glw::GLint stdTemp = stdU.m_int;

				glw::GLboolean diffCpuFma = de::abs(cpuTemp - fmaTemp) > 2;
				glw::GLboolean diffCpuStd = de::abs(cpuTemp - stdTemp) > 2;
				glw::GLboolean diffFmaStd = de::abs(fmaTemp - stdTemp) > 2;

				if (diffCpuFma || diffCpuStd || diffFmaStd)
				{
					rounding_mode_failed = true;
					break;
				}
			}

			if (rounding_mode_failed)
			{
				break;
			}
			else
			{
				test_failed = false;
			}
		} /* for (all elements) */
	}	 /* for (all rounding modes) */

	if (test_failed)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "The values of resultStd[i] & 0xFFFFFFFE and resultFma[i] & 0xFFFFFFFE and resultCPU[i] & 0xFFFFFFFE "
			<< "are not bitwise equal for i = 0..99\n"
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}